

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O3

_Bool netaddr_acl_check_accept(netaddr_acl *acl,netaddr *addr)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  netaddr *pnVar5;
  
  if ((acl->reject_first == true) && (uVar1 = acl->reject_count, uVar1 != 0)) {
    pnVar5 = acl->reject;
    _Var3 = netaddr_is_in_subnet(pnVar5,addr);
    if (_Var3) {
      return false;
    }
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      pnVar5 = pnVar5 + 1;
      if (uVar1 == uVar4) break;
      _Var3 = netaddr_is_in_subnet(pnVar5,addr);
      uVar2 = uVar4 + 1;
    } while (!_Var3);
    if (uVar4 < uVar1) {
      return false;
    }
  }
  uVar1 = acl->accept_count;
  if (uVar1 != 0) {
    pnVar5 = acl->accept;
    _Var3 = netaddr_is_in_subnet(pnVar5,addr);
    if (_Var3) {
      return true;
    }
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      pnVar5 = pnVar5 + 1;
      if (uVar1 == uVar4) break;
      _Var3 = netaddr_is_in_subnet(pnVar5,addr);
      uVar2 = uVar4 + 1;
    } while (!_Var3);
    if (uVar4 < uVar1) {
      return true;
    }
  }
  if ((acl->reject_first == false) && (uVar1 = acl->reject_count, uVar1 != 0)) {
    pnVar5 = acl->reject;
    _Var3 = netaddr_is_in_subnet(pnVar5,addr);
    if (!_Var3) {
      uVar2 = 1;
      do {
        uVar4 = uVar2;
        pnVar5 = pnVar5 + 1;
        if (uVar1 == uVar4) break;
        _Var3 = netaddr_is_in_subnet(pnVar5,addr);
        uVar2 = uVar4 + 1;
      } while (!_Var3);
      if (uVar1 <= uVar4) goto LAB_00147044;
    }
    return false;
  }
LAB_00147044:
  return acl->accept_default;
}

Assistant:

bool
netaddr_acl_check_accept(const struct netaddr_acl *acl, const struct netaddr *addr) {
  if (acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  if (_is_in_array(acl->accept, acl->accept_count, addr)) {
    return true;
  }

  if (!acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  return acl->accept_default;
}